

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_barrier.cpp
# Opt level: O1

void __thiscall SharedBarrier::SharedBarrier(SharedBarrier *this,uint32_t count)

{
  __pid_t _Var1;
  SharedMemoryObject<pthread_barrier_t> *this_00;
  pointer __p;
  __uniq_ptr_impl<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  local_28;
  
  (this->barrier_)._M_t.
  super___uniq_ptr_impl<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  .super__Head_base<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_false>._M_head_impl =
       (SharedMemoryObject<pthread_barrier_t> *)0x0;
  this_00 = (SharedMemoryObject<pthread_barrier_t> *)operator_new(8);
  SharedMemoryObject<pthread_barrier_t>::SharedMemoryObject<>(this_00);
  local_28._M_t.
  super__Tuple_impl<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  .super__Head_base<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_false>._M_head_impl =
       (tuple<SharedMemoryObject<pthread_barrier_t>_*,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
        )(_Tuple_impl<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  ::reset((__uniq_ptr_impl<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
           *)this,this_00);
  std::
  unique_ptr<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  ::~unique_ptr((unique_ptr<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
                 *)&local_28);
  init(this,(EVP_PKEY_CTX *)(ulong)count);
  _Var1 = getpid();
  this->owner_pid_ = _Var1;
  return;
}

Assistant:

SharedBarrier::SharedBarrier(uint32_t count) {
    barrier_ = std::make_unique<SharedMemoryObject<pthread_barrier_t>>();
    init(count);
    owner_pid_ = getpid();
}